

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Buffer.cxx
# Opt level: O2

void __thiscall Fl_Text_Buffer::text(Fl_Text_Buffer *this,char *t)

{
  int nDeleted;
  int nInserted;
  char *deletedText;
  size_t sVar1;
  char *__dest;
  
  if (t == (char *)0x0) {
    t = "";
  }
  call_predelete_callbacks(this,0,this->mLength);
  deletedText = text(this);
  nDeleted = this->mLength;
  free(this->mBuf);
  sVar1 = strlen(t);
  nInserted = (int)sVar1;
  sVar1 = (long)this->mPreferredGapSize + (long)nInserted;
  __dest = (char *)malloc(sVar1);
  this->mBuf = __dest;
  this->mLength = nInserted;
  this->mGapStart = nInserted;
  this->mGapEnd = (int)sVar1;
  memcpy(__dest,t,(long)nInserted);
  update_selections(this,0,nDeleted,0);
  call_modify_callbacks(this,0,nDeleted,nInserted,0,deletedText);
  free(deletedText);
  return;
}

Assistant:

void Fl_Text_Buffer::text(const char *t)
{
  IS_UTF8_ALIGNED(t)

  // if t is null then substitute it with an empty string
  // then don't return so that internal cleanup can happen
  if (!t) t="";

  call_predelete_callbacks(0, length());
  
  /* Save information for redisplay, and get rid of the old buffer */
  const char *deletedText = text();
  int deletedLength = mLength;
  free((void *) mBuf);
  
  /* Start a new buffer with a gap of mPreferredGapSize at the end */
  int insertedLength = (int) strlen(t);
  mBuf = (char *) malloc(insertedLength + mPreferredGapSize);
  mLength = insertedLength;
  mGapStart = insertedLength;
  mGapEnd = mGapStart + mPreferredGapSize;
  memcpy(mBuf, t, insertedLength);
  
  /* Zero all of the existing selections */
  update_selections(0, deletedLength, 0);
  
  /* Call the saved display routine(s) to update the screen */
  call_modify_callbacks(0, deletedLength, insertedLength, 0, deletedText);
  free((void *) deletedText);
}